

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_class_equip(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  parser_error pVar5;
  void *pvVar6;
  char *pcVar7;
  char *__s;
  char *__s1;
  void *p_00;
  wchar_t *p_01;
  long lVar8;
  int iVar9;
  int iVar10;
  wchar_t result;
  int iVar11;
  bool bVar12;
  
  pvVar6 = parser_priv(p);
  if (pvVar6 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar7 = parser_getsym(p,"tval");
    wVar2 = tval_find_idx(pcVar7);
    if (wVar2 < L'\0') {
      pVar5 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar7 = parser_getsym(p,"sval");
      wVar3 = lookup_sval(wVar2,pcVar7);
      if (wVar3 < L'\0') {
        pVar5 = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        pcVar7 = parser_getsym(p,"eopts");
        __s = string_make(pcVar7);
        pcVar7 = strtok(__s," |");
        p_00 = (void *)0x0;
        iVar9 = 0;
        iVar10 = 0;
        do {
          if (pcVar7 == (char *)0x0) {
            string_free(__s);
            p_01 = (wchar_t *)mem_zalloc(0x20);
            *p_01 = wVar2;
            p_01[1] = wVar3;
            wVar2 = parser_getuint(p,"min");
            p_01[2] = wVar2;
            wVar2 = parser_getuint(p,"max");
            p_01[3] = wVar2;
            *(void **)(p_01 + 4) = p_00;
            if (L'c' < wVar2 || L'c' < p_01[2]) {
              mem_free(p_00);
              mem_free(p_01);
              return PARSE_ERROR_INVALID_ITEM_NUMBER;
            }
            *(undefined8 *)(p_01 + 6) = *(undefined8 *)((long)pvVar6 + 0xe8);
            *(wchar_t **)((long)pvVar6 + 0xe8) = p_01;
            return PARSE_ERROR_NONE;
          }
          _Var1 = prefix(pcVar7,"NOT-");
          pcVar7 = pcVar7 + (ulong)_Var1 * 4;
          iVar11 = 1;
          do {
            __s1 = option_name(iVar11);
            iVar4 = strcmp(__s1,pcVar7);
            if (iVar4 == 0) goto LAB_0016081f;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 0x2d);
          iVar11 = 0;
LAB_0016081f:
          if ((iVar11 == 0) || (iVar4 = option_type(iVar11), iVar4 != 1)) {
            iVar11 = strcmp(pcVar7,"none");
            if (iVar11 == 0) goto LAB_001608a8;
            mem_free(p_00);
            string_free(__s);
            bVar12 = false;
          }
          else {
            if (iVar10 + -2 <= iVar9) {
              bVar12 = iVar10 == 0;
              iVar10 = iVar10 * 2;
              if (bVar12) {
                iVar10 = 2;
              }
              p_00 = mem_realloc(p_00,(long)iVar10 << 2);
            }
            iVar4 = -iVar11;
            if (!_Var1) {
              iVar4 = iVar11;
            }
            lVar8 = (long)iVar9;
            *(int *)((long)p_00 + lVar8 * 4) = iVar4;
            iVar9 = iVar9 + 1;
            *(undefined4 *)((long)p_00 + lVar8 * 4 + 4) = 0;
LAB_001608a8:
            pcVar7 = strtok((char *)0x0," |");
            bVar12 = true;
          }
        } while (bVar12);
        pVar5 = PARSE_ERROR_INVALID_OPTION;
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_class_equip(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct start_item *si;
	int tval, sval;
	char *eopts;
	char *s;
	int *einds;
	int nind, nalloc;

	if (!c)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	eopts = string_make(parser_getsym(p, "eopts"));
	einds = NULL;
	nind = 0;
	nalloc = 0;
	s = strtok(eopts, " |");
	while (s) {
		bool negated = false;
		int ind;

		if (prefix(s, "NOT-")) {
			negated = true;
			s += 4;
		}
		ind = lookup_option(s);
		if (ind > 0 && option_type(ind) == OP_BIRTH) {
			if (nind >= nalloc - 2) {
				if (nalloc == 0) {
					nalloc = 2;
				} else {
					nalloc *= 2;
				}
				einds = mem_realloc(einds,
					nalloc * sizeof(*einds));
			}
			einds[nind] = (negated) ? -ind : ind;
			einds[nind + 1] = 0;
			++nind;
		} else if (!streq(s, "none")) {
			mem_free(einds);
			string_free(eopts);
			return PARSE_ERROR_INVALID_OPTION;
		}
		s = strtok(NULL, " |");
	}
	string_free(eopts);

	si = mem_zalloc(sizeof *si);
	si->tval = tval;
	si->sval = sval;
	si->min = parser_getuint(p, "min");
	si->max = parser_getuint(p, "max");
	si->eopts = einds;

	if (si->min > 99 || si->max > 99) {
		mem_free(si->eopts);
		mem_free(si);
		return PARSE_ERROR_INVALID_ITEM_NUMBER;
	}

	si->next = c->start_items;
	c->start_items = si;

	return PARSE_ERROR_NONE;
}